

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

int setupClient(Address *address)

{
  int iVar1;
  undefined1 local_28 [8];
  sockaddr_in server_addr;
  int ret;
  int sockfd;
  Address *address_local;
  
  server_addr.sin_zero._4_4_ = socket(2,1,0);
  if (server_addr.sin_zero._4_4_ == -1) {
    perror_die("socket()");
    exit(0);
  }
  printf("\x1b[32m[+] Socket successfully created.\n\x1b[0m");
  memset(local_28,0,0x10);
  local_28._0_2_ = 2;
  local_28._4_4_ = inet_addr(address->ip);
  local_28._2_2_ = htons((uint16_t)address->port);
  server_addr.sin_zero._0_4_ = connect(server_addr.sin_zero._4_4_,(sockaddr *)local_28,0x10);
  if (server_addr.sin_zero._0_4_ == 0) {
    printf("\x1b[32m[+] Connected to the server.\n\x1b[0m");
  }
  else {
    perror_die("connect()");
  }
  iVar1._0_1_ = server_addr.sin_zero[4];
  iVar1._1_1_ = server_addr.sin_zero[5];
  iVar1._2_1_ = server_addr.sin_zero[6];
  iVar1._3_1_ = server_addr.sin_zero[7];
  return iVar1;
}

Assistant:

int 
setupClient(Address* address)
{
    /* 
     * socket() -> connect()
     */

    int sockfd;          // socket file descriptor
    int ret;

    // int addressfd;
    struct sockaddr_in server_addr;
    // struct sockaddr_in cli;

    // socket create and varification
    sockfd = socket(AF_INET, SOCK_STREAM, 0);
    if (sockfd == -1) {
        perror_die("socket()");
        exit(0);
    }
    #if DEBUG
        else
            printf(ANSI_COLOR_GREEN "[+] Socket successfully created.\n" ANSI_COLOR_RESET);
    #endif

    // clean memory space of server_addr
    #if 0
        bzero(&server_addr, sizeof(server_addr));       // bzero is deprecated. works but memset is better
                                                        // https://www.quora.com/In-C-what-is-the-difference-between-bzero-and-memset
    #else
        memset(&server_addr, '\0', sizeof(server_addr));
    #endif

    // assign IP, PORT
    server_addr.sin_family = AF_INET;
    server_addr.sin_addr.s_addr = inet_addr(address->ip);
    server_addr.sin_port = htons(address->port);

    // addressect the client socket to server socket
    ret = connect(sockfd, (struct sockaddr*) &server_addr, sizeof(server_addr));
    if (ret != 0) {
        perror_die("connect()");
    }
    #if DEBUG
        else
            printf(ANSI_COLOR_GREEN "[+] Connected to the server.\n" ANSI_COLOR_RESET);
    #endif


    return sockfd;
}